

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tct3img.cpp
# Opt level: O2

void __thiscall CTcGenTarg::write_sources_to_object_file(CTcGenTarg *this,CVmFile *fp)

{
  CTcTokFileDesc *pCVar1;
  char *__s;
  size_t buflen;
  CTcTokFileDesc **ppCVar2;
  
  CVmFile::write_uint2(fp,G_tok->next_filedesc_id_);
  ppCVar2 = &G_tok->desc_head_;
  while (pCVar1 = *ppCVar2, pCVar1 != (CTcTokFileDesc *)0x0) {
    __s = pCVar1->fname_;
    buflen = strlen(__s);
    CVmFile::write_uint2(fp,(uint)buflen);
    CVmFile::write_bytes(fp,__s,buflen);
    ppCVar2 = &pCVar1->next_;
  }
  return;
}

Assistant:

void CTcGenTarg::write_sources_to_object_file(CVmFile *fp)
{
    CTcTokFileDesc *desc;

    /* write the number of entries */
    fp->write_uint2(G_tok->get_filedesc_count());

    /* write the entries */
    for (desc = G_tok->get_first_filedesc() ; desc != 0 ;
         desc = desc->get_next())
    {
        size_t len;
        const char *fname;

        /* get the filename - use the resolved local filename */
        fname = desc->get_fname();

        /* write the length of the filename */
        len = strlen(fname);
        fp->write_uint2(len);

        /* write the filename */
        fp->write_bytes(fname, len);
    }
}